

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O0

bool __thiscall
cppcms::sessions::session_file_storage::read_all(session_file_storage *this,int fd,void *vbuf,int n)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  int res;
  char *buf;
  int local_24;
  
  local_24 = in_ECX;
  while( true ) {
    do {
      if (local_24 < 1) {
        return true;
      }
      sVar2 = read(in_ESI,in_RDX,(long)local_24);
      iVar1 = (int)sVar2;
    } while ((iVar1 < 0) && (piVar3 = __errno_location(), *piVar3 == 4));
    if (iVar1 < 1) break;
    local_24 = local_24 - iVar1;
  }
  return false;
}

Assistant:

bool session_file_storage::read_all(int fd,void *vbuf,int n)
{
	char *buf=reinterpret_cast<char *>(vbuf);
	while(n > 0) {
		int res = ::read(fd,buf,n);
		if(res < 0 && errno==EINTR)
			continue;
		if(res <= 0)
			return false;
		n-=res;
	}
	return true;
}